

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solution.cpp
# Opt level: O0

void __thiscall Solution::validate(Solution *this)

{
  Vehicle *pVVar1;
  bool bVar2;
  reference ppVVar3;
  reference psVar4;
  element_type *peVar5;
  mapped_type *pmVar6;
  Solution *local_68;
  int local_5c;
  undefined1 local_58 [4];
  int pos;
  shared_ptr<VehicleState> vs;
  _Self local_40;
  iterator it;
  int i;
  Vehicle *vehicle;
  iterator __end1;
  iterator __begin1;
  list<Vehicle_*,_std::allocator<Vehicle_*>_> *__range1;
  Solution *this_local;
  
  __end1 = std::__cxx11::list<Vehicle_*,_std::allocator<Vehicle_*>_>::begin(&this->vehicles);
  vehicle = (Vehicle *)
            std::__cxx11::list<Vehicle_*,_std::allocator<Vehicle_*>_>::end(&this->vehicles);
  while( true ) {
    bVar2 = std::operator!=(&__end1,(_Self *)&vehicle);
    if (!bVar2) break;
    ppVVar3 = std::_List_iterator<Vehicle_*>::operator*(&__end1);
    pVVar1 = *ppVVar3;
    it._M_node._4_4_ = 0;
    local_40._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<std::shared_ptr<VehicleState>,_std::allocator<std::shared_ptr<VehicleState>_>_>::begin
                   (&pVVar1->nodes);
    while( true ) {
      vs.super___shared_ptr<VehicleState,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           std::__cxx11::
           list<std::shared_ptr<VehicleState>,_std::allocator<std::shared_ptr<VehicleState>_>_>::end
                     (&pVVar1->nodes);
      bVar2 = std::operator!=(&local_40,
                              (_Self *)&vs.
                                        super___shared_ptr<VehicleState,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_refcount);
      if (!bVar2) break;
      psVar4 = std::_List_iterator<std::shared_ptr<VehicleState>_>::operator*(&local_40);
      std::shared_ptr<VehicleState>::shared_ptr((shared_ptr<VehicleState> *)local_58,psVar4);
      peVar5 = std::__shared_ptr_access<VehicleState,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<VehicleState,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_58);
      local_68 = this;
      pmVar6 = std::
               unordered_map<Solution_*,_std::pair<Vehicle_*,_int>,_std::hash<Solution_*>,_std::equal_to<Solution_*>,_std::allocator<std::pair<Solution_*const,_std::pair<Vehicle_*,_int>_>_>_>
               ::operator[](&peVar5->p->state,&local_68);
      local_5c = pmVar6->second;
      if (it._M_node._4_4_ != local_5c) {
        std::operator<<((ostream *)&std::cout,"invalid state");
      }
      it._M_node._4_4_ = it._M_node._4_4_ + 1;
      std::shared_ptr<VehicleState>::~shared_ptr((shared_ptr<VehicleState> *)local_58);
      std::_List_iterator<std::shared_ptr<VehicleState>_>::operator++(&local_40);
    }
    std::_List_iterator<Vehicle_*>::operator++(&__end1);
  }
  return;
}

Assistant:

void Solution::validate() {
    for (auto vehicle: vehicles) {
        auto i = 0;
        for (auto it = vehicle->nodes.begin(); it != vehicle->nodes.end(); ++it) {
            auto vs = *it;
            auto pos = vs->p->state[this].second;
            if (i != pos) {
                std::cout << "invalid state";
            }
            i++;
        }
    }
}